

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O3

void __thiscall ElfFile::writeHeader(ElfFile *this,ByteArray *data,size_t pos,Endianness endianness)

{
  Elf32_Half EVar1;
  byte *pbVar2;
  undefined8 uVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  pbVar2 = (this->fileData).data_;
  uVar3 = *(undefined8 *)((this->fileHeader).e_ident + 8);
  *(undefined8 *)pbVar2 = *(undefined8 *)(this->fileHeader).e_ident;
  *(undefined8 *)(pbVar2 + 8) = uVar3;
  uVar4 = data->size_;
  if (pos + 0x11 < uVar4) {
    EVar1 = (this->fileHeader).e_type;
    pbVar2 = data->data_;
    bVar5 = (byte)(EVar1 >> 8);
    bVar6 = (byte)EVar1;
    bVar7 = bVar5;
    if (endianness == Little) {
      bVar7 = bVar6;
    }
    pbVar2[pos + 0x10] = bVar7;
    if (endianness != Little) {
      bVar5 = bVar6;
    }
    pbVar2[pos + 0x11] = bVar5;
    uVar4 = data->size_;
  }
  if (pos + 0x13 < uVar4) {
    EVar1 = (this->fileHeader).e_machine;
    pbVar2 = data->data_;
    bVar5 = (byte)(EVar1 >> 8);
    bVar6 = (byte)EVar1;
    bVar7 = bVar5;
    if (endianness == Little) {
      bVar7 = bVar6;
    }
    pbVar2[pos + 0x12] = bVar7;
    if (endianness != Little) {
      bVar5 = bVar6;
    }
    pbVar2[pos + 0x13] = bVar5;
  }
  ByteArray::replaceDoubleWord(data,pos + 0x14,(this->fileHeader).e_version,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x18,(this->fileHeader).e_entry,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x1c,(this->fileHeader).e_phoff,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x20,(this->fileHeader).e_shoff,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x24,(this->fileHeader).e_flags,endianness);
  uVar4 = data->size_;
  if (pos + 0x29 < uVar4) {
    EVar1 = (this->fileHeader).e_ehsize;
    pbVar2 = data->data_;
    bVar5 = (byte)(EVar1 >> 8);
    bVar6 = (byte)EVar1;
    bVar7 = bVar5;
    if (endianness == Little) {
      bVar7 = bVar6;
    }
    pbVar2[pos + 0x28] = bVar7;
    if (endianness != Little) {
      bVar5 = bVar6;
    }
    pbVar2[pos + 0x29] = bVar5;
    uVar4 = data->size_;
  }
  if (pos + 0x2b < uVar4) {
    EVar1 = (this->fileHeader).e_phentsize;
    pbVar2 = data->data_;
    bVar5 = (byte)(EVar1 >> 8);
    bVar6 = (byte)EVar1;
    bVar7 = bVar5;
    if (endianness == Little) {
      bVar7 = bVar6;
    }
    pbVar2[pos + 0x2a] = bVar7;
    if (endianness != Little) {
      bVar5 = bVar6;
    }
    pbVar2[pos + 0x2b] = bVar5;
    uVar4 = data->size_;
  }
  if (pos + 0x2d < uVar4) {
    EVar1 = (this->fileHeader).e_phnum;
    pbVar2 = data->data_;
    bVar5 = (byte)(EVar1 >> 8);
    bVar6 = (byte)EVar1;
    bVar7 = bVar5;
    if (endianness == Little) {
      bVar7 = bVar6;
    }
    pbVar2[pos + 0x2c] = bVar7;
    if (endianness != Little) {
      bVar5 = bVar6;
    }
    pbVar2[pos + 0x2d] = bVar5;
    uVar4 = data->size_;
  }
  if (pos + 0x2f < uVar4) {
    EVar1 = (this->fileHeader).e_shentsize;
    pbVar2 = data->data_;
    bVar5 = (byte)(EVar1 >> 8);
    bVar6 = (byte)EVar1;
    bVar7 = bVar5;
    if (endianness == Little) {
      bVar7 = bVar6;
    }
    pbVar2[pos + 0x2e] = bVar7;
    if (endianness != Little) {
      bVar5 = bVar6;
    }
    pbVar2[pos + 0x2f] = bVar5;
    uVar4 = data->size_;
  }
  if (pos + 0x31 < uVar4) {
    EVar1 = (this->fileHeader).e_shnum;
    pbVar2 = data->data_;
    bVar5 = (byte)(EVar1 >> 8);
    bVar6 = (byte)EVar1;
    bVar7 = bVar5;
    if (endianness == Little) {
      bVar7 = bVar6;
    }
    pbVar2[pos + 0x30] = bVar7;
    if (endianness != Little) {
      bVar5 = bVar6;
    }
    pbVar2[pos + 0x31] = bVar5;
    uVar4 = data->size_;
  }
  if (pos + 0x33 < uVar4) {
    EVar1 = (this->fileHeader).e_shstrndx;
    pbVar2 = data->data_;
    bVar5 = (byte)(EVar1 >> 8);
    bVar6 = (byte)EVar1;
    bVar7 = bVar5;
    if (endianness == Little) {
      bVar7 = bVar6;
    }
    pbVar2[pos + 0x32] = bVar7;
    if (endianness != Little) {
      bVar5 = bVar6;
    }
    pbVar2[pos + 0x33] = bVar5;
  }
  return;
}

Assistant:

void ElfFile::writeHeader(ByteArray& data, size_t pos, Endianness endianness)
{
	memcpy(&fileData[0], fileHeader.e_ident, sizeof(fileHeader.e_ident));
	data.replaceWord(pos + 0x10, fileHeader.e_type, endianness);
	data.replaceWord(pos + 0x12, fileHeader.e_machine, endianness);
	data.replaceDoubleWord(pos + 0x14, fileHeader.e_version, endianness);
	data.replaceDoubleWord(pos + 0x18, fileHeader.e_entry, endianness);
	data.replaceDoubleWord(pos + 0x1C, fileHeader.e_phoff, endianness);
	data.replaceDoubleWord(pos + 0x20, fileHeader.e_shoff, endianness);
	data.replaceDoubleWord(pos + 0x24, fileHeader.e_flags, endianness);
	data.replaceWord(pos + 0x28, fileHeader.e_ehsize, endianness);
	data.replaceWord(pos + 0x2A, fileHeader.e_phentsize, endianness);
	data.replaceWord(pos + 0x2C, fileHeader.e_phnum, endianness);
	data.replaceWord(pos + 0x2E, fileHeader.e_shentsize, endianness);
	data.replaceWord(pos + 0x30, fileHeader.e_shnum, endianness);
	data.replaceWord(pos + 0x32, fileHeader.e_shstrndx, endianness);
}